

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O2

void __thiscall QPDFCryptoProvider::QPDFCryptoProvider(QPDFCryptoProvider *this)

{
  bool bVar1;
  string default_crypto;
  allocator<char> local_79;
  string local_78;
  string local_58;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  std::make_shared<QPDFCryptoProvider::Members>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"openssl",(allocator<char> *)&local_58);
  local_38[1] = (code *)0x0;
  local_38[0] = std::make_shared<QPDFCrypto_openssl>;
  local_20 = std::
             _Function_handler<std::shared_ptr<QPDFCryptoImpl>_(),_std::shared_ptr<QPDFCrypto_openssl>_(*)()>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<std::shared_ptr<QPDFCryptoImpl>_(),_std::shared_ptr<QPDFCrypto_openssl>_(*)()>
             ::_M_manager;
  registerImpl_internal(this,&local_78,(provider_fn *)local_38);
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  std::__cxx11::string::~string((string *)&local_78);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"QPDF_CRYPTO_PROVIDER",&local_79);
  bVar1 = QUtil::get_env(&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&local_78);
  }
  setDefaultProvider_internal(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

QPDFCryptoProvider::QPDFCryptoProvider() :
    m(std::make_shared<Members>())
{
#ifdef USE_CRYPTO_NATIVE
    registerImpl_internal("native", std::make_shared<QPDFCrypto_native>);
#endif
#ifdef USE_CRYPTO_GNUTLS
    registerImpl_internal("gnutls", std::make_shared<QPDFCrypto_gnutls>);
#endif
#ifdef USE_CRYPTO_OPENSSL
    registerImpl_internal("openssl", std::make_shared<QPDFCrypto_openssl>);
#endif
    std::string default_crypto;
    if (!QUtil::get_env("QPDF_CRYPTO_PROVIDER", &default_crypto)) {
        default_crypto = DEFAULT_CRYPTO;
    }
    setDefaultProvider_internal(default_crypto);
}